

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordering.h
# Opt level: O2

Expression *
wasm::getResultOfFirst
          (Expression *first,Expression *second,Function *func,Module *wasm,PassOptions *passOptions
          )

{
  Type type;
  bool bVar1;
  Index index;
  Drop *pDVar2;
  Block *pBVar3;
  Module *pMVar4;
  ulong extraout_RDX;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  LocalSet *local_60;
  Expression *local_58;
  LocalGet *local_50;
  initializer_list<wasm::Expression_*> local_48;
  Builder local_38;
  Builder builder;
  
  if ((first->type).id < 2) {
    __assert_fail("first->type.isConcrete()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ordering.h"
                  ,0x2f,
                  "Expression *wasm::getResultOfFirst(Expression *, Expression *, Function *, Module *, const PassOptions &)"
                 );
  }
  local_38.wasm = wasm;
  if ((second->type).id == 1) {
    pDVar2 = Builder::makeDrop(&local_38,first);
    pMVar4 = wasm;
    first = second;
    second = (Expression *)pDVar2;
  }
  else {
    pMVar4 = (Module *)second;
    bVar1 = EffectAnalyzer::canReorder(passOptions,wasm,first,second);
    if (!bVar1) {
      type.id = (first->type).id;
      index = Builder::addVar(func,type);
      local_60 = Builder::makeLocalSet(&local_38,index,first);
      local_58 = second;
      local_50 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      local_50->index = index;
      (local_50->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           type.id;
      local_48._M_len = 3;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX
      ;
      local_48._M_array = (iterator)&local_60;
      pBVar3 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                         (&local_38,&local_48,type_01);
      return (Expression *)pBVar3;
    }
  }
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pMVar4;
  pBVar3 = Builder::makeSequence(&local_38,second,first,type_00);
  return (Expression *)pBVar3;
}

Assistant:

inline Expression* getResultOfFirst(Expression* first,
                                    Expression* second,
                                    Function* func,
                                    Module* wasm,
                                    const PassOptions& passOptions) {
  assert(first->type.isConcrete());

  Builder builder(*wasm);

  if (second->type == Type::unreachable) {
    // No value is actually consumed here. Emit something with unreachable type.
    // (Note that if we continued to the canReorder code after us, and emitted
    // second followed by first, then the block would have a concrete type due
    // to the last element having such a type - which would not have unreachable
    // type.)
    return builder.makeSequence(builder.makeDrop(first), second);
  }

  if (EffectAnalyzer::canReorder(passOptions, *wasm, first, second)) {
    return builder.makeSequence(second, first);
  }

  auto type = first->type;
  auto index = Builder::addVar(func, type);
  return builder.makeBlock({builder.makeLocalSet(index, first),
                            second,
                            builder.makeLocalGet(index, type)});
}